

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

void Bbl_ManAddFanin(Bbl_Man_t *p,int ObjId,int FaninId)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  char *pcVar6;
  
  uVar5 = CONCAT44(in_register_00000034,ObjId);
  piVar4 = p->vId2Obj->pArray;
  iVar1 = piVar4[ObjId];
  pcVar6 = p->pObjs->pArray;
  if ((*(uint *)(pcVar6 + (long)iVar1 + 8) & 1) == 0) {
    iVar2 = piVar4[FaninId];
    if ((pcVar6[(long)iVar2 + 8] & 2U) == 0) {
      if ((-1 < ObjId) && (ObjId < p->vFaninNums->nSize)) {
        piVar4 = p->vFaninNums->pArray;
        iVar3 = piVar4[(uint)ObjId];
        if (iVar3 < (int)(*(uint *)(pcVar6 + (long)iVar1 + 8) >> 4)) {
          piVar4[(uint)ObjId] = iVar3 + 1;
          *(int *)(pcVar6 + (long)iVar3 * 4 + (long)iVar1 + 0xc) = iVar1 - iVar2;
          return;
        }
        printf(
              "Bbl_ManAddFanin(): Trying to add more fanins to object (Id = %d) than declared (%d).\n"
              );
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/bbl/bblif.c"
                    ,0x10e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pcVar6 = "Bbl_ManAddFanin(): Cannot add fanout of the combinational output (Id = %d).\n";
    uVar5 = (ulong)(uint)FaninId;
  }
  else {
    pcVar6 = "Bbl_ManAddFanin(): Cannot add fanin of the combinational input (Id = %d).\n";
  }
  printf(pcVar6,uVar5);
  return;
}

Assistant:

void Bbl_ManAddFanin( Bbl_Man_t * p, int ObjId, int FaninId )
{
    Bbl_Obj_t * pObj, * pFanin;
    int iFanin;
    pObj   = Bbl_ManObj( p, ObjId );
    if ( Bbl_ObjIsCi(pObj) )
    {
        printf( "Bbl_ManAddFanin(): Cannot add fanin of the combinational input (Id = %d).\n", ObjId );
        return;
    }
    pFanin = Bbl_ManObj( p, FaninId );
    if ( Bbl_ObjIsCo(pFanin) )
    {
        printf( "Bbl_ManAddFanin(): Cannot add fanout of the combinational output (Id = %d).\n", FaninId );
        return;
    }
    iFanin = Vec_IntEntry( p->vFaninNums, ObjId );
    if ( iFanin >= (int)pObj->nFanins )
    {
        printf( "Bbl_ManAddFanin(): Trying to add more fanins to object (Id = %d) than declared (%d).\n", ObjId, pObj->nFanins );
        return;
    }
    assert( iFanin < (int)pObj->nFanins );
    Vec_IntWriteEntry( p->vFaninNums, ObjId, iFanin+1 );
    pObj->pFanins[iFanin] = (char *)pObj - (char *)pFanin;
}